

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null.cpp
# Opt level: O0

EffectState * __thiscall anon_unknown.dwarf_1510a0::NullStateFactory::create(NullStateFactory *this)

{
  EffectState *this_00;
  size_t in_stack_ffffffffffffffe0;
  
  this_00 = (EffectState *)(anonymous_namespace)::NullState::operator_new(in_stack_ffffffffffffffe0)
  ;
  NullState::NullState((NullState *)this_00);
  return this_00;
}

Assistant:

EffectState *NullStateFactory::create()
{ return new NullState{}; }